

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O3

void __thiscall Nes_Square::run(Nes_Square *this,nes_time_t time,nes_time_t end_time)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  Blip_Buffer *pBVar4;
  Blip_Synth<12,_1> *this_00;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar7 = (uint)(this->super_Nes_Envelope).super_Nes_Osc.regs[2] |
          ((this->super_Nes_Envelope).super_Nes_Osc.regs[3] & 7) << 8;
  iVar1 = uVar7 * 2 + 2;
  pBVar4 = (this->super_Nes_Envelope).super_Nes_Osc.output;
  if (pBVar4 != (Blip_Buffer *)0x0) {
    pBVar4->modified_ = 1;
    if ((this->super_Nes_Envelope).super_Nes_Osc.length_counter != 0) {
      bVar2 = (this->super_Nes_Envelope).super_Nes_Osc.regs[0];
      if ((bVar2 & 0x10) == 0) {
        uVar9 = (this->super_Nes_Envelope).envelope;
      }
      else {
        uVar9 = bVar2 & 0xf;
      }
      if ((7 < uVar7) && (uVar9 != 0)) {
        bVar3 = (this->super_Nes_Envelope).super_Nes_Osc.regs[1];
        uVar8 = uVar7 >> (bVar3 & 7);
        if ((bVar3 & 8) != 0) {
          uVar8 = 0;
        }
        if (uVar8 + uVar7 < 0x800) {
          bVar2 = bVar2 >> 6;
          uVar7 = 2;
          if (bVar2 != 3) {
            uVar7 = 1 << bVar2;
          }
          uVar8 = 0;
          if (bVar2 == 3) {
            uVar8 = uVar9;
          }
          iVar6 = (this->super_Nes_Envelope).super_Nes_Osc.last_amp;
          uVar10 = 0;
          if (this->phase < (int)uVar7) {
            uVar10 = uVar9;
          }
          uVar10 = uVar10 ^ uVar8;
          (this->super_Nes_Envelope).super_Nes_Osc.last_amp = uVar10;
          iVar6 = uVar10 - iVar6;
          if (iVar6 != 0) {
            Blip_Synth<12,_1>::offset(this->synth,time,iVar6,pBVar4);
          }
          iVar6 = time + (this->super_Nes_Envelope).super_Nes_Osc.delay;
          if (iVar6 < end_time) {
            pBVar4 = (this->super_Nes_Envelope).super_Nes_Osc.output;
            this_00 = this->synth;
            iVar5 = uVar10 * 2 - uVar9;
            uVar8 = this->phase;
            do {
              uVar8 = uVar8 + 1 & 7;
              if ((uVar8 & ~uVar7) == 0) {
                iVar5 = -iVar5;
                Blip_Synth<12,_1>::offset_inline(this_00,iVar6,iVar5,pBVar4);
              }
              iVar6 = iVar6 + iVar1;
            } while (iVar6 < end_time);
            (this->super_Nes_Envelope).super_Nes_Osc.last_amp = (int)(iVar5 + uVar9) >> 1;
            this->phase = uVar8;
          }
          goto LAB_006fe649;
        }
      }
    }
    iVar6 = (this->super_Nes_Envelope).super_Nes_Osc.last_amp;
    if (iVar6 != 0) {
      Blip_Synth<12,_1>::offset(this->synth,time,-iVar6,pBVar4);
      (this->super_Nes_Envelope).super_Nes_Osc.last_amp = 0;
    }
  }
  iVar6 = time + (this->super_Nes_Envelope).super_Nes_Osc.delay;
  if (end_time - iVar6 != 0 && iVar6 <= end_time) {
    iVar5 = (int)((end_time - iVar6) + uVar7 * 2 + 1) / iVar1;
    this->phase = this->phase + iVar5 & 7;
    iVar6 = iVar6 + iVar5 * iVar1;
  }
LAB_006fe649:
  (this->super_Nes_Envelope).super_Nes_Osc.delay = iVar6 - end_time;
  return;
}

Assistant:

void Nes_Square::run( nes_time_t time, nes_time_t end_time )
{
	const int period = this->period();
	const int timer_period = (period + 1) * 2;
	
	if ( !output )
	{
		delay = maintain_phase( time + delay, end_time, timer_period ) - end_time;
		return;
	}
	
	output->set_modified();
	
	int offset = period >> (regs [1] & shift_mask);
	if ( regs [1] & negate_flag )
		offset = 0;
	
	const int volume = this->volume();
	if ( volume == 0 || period < 8 || (period + offset) >= 0x800 )
	{
		if ( last_amp ) {
			synth.offset( time, -last_amp, output );
			last_amp = 0;
		}
		
		time += delay;
		time = maintain_phase( time, end_time, timer_period );
	}
	else
	{
		// handle duty select
		int duty_select = (regs [0] >> 6) & 3;
		int duty = 1 << duty_select; // 1, 2, 4, 2
		int amp = 0;
		if ( duty_select == 3 ) {
			duty = 2; // negated 25%
			amp = volume;
		}
		if ( phase < duty )
			amp ^= volume;
		
		{
			int delta = update_amp( amp );
			if ( delta )
				synth.offset( time, delta, output );
		}
		
		time += delay;
		if ( time < end_time )
		{
			Blip_Buffer* const output = this->output;
			const Synth& synth = this->synth;
			int delta = amp * 2 - volume;
			int phase = this->phase;
			
			do {
				phase = (phase + 1) & (phase_range - 1);
				if ( phase == 0 || phase == duty ) {
					delta = -delta;
					synth.offset_inline( time, delta, output );
				}
				time += timer_period;
			}
			while ( time < end_time );
			
			last_amp = (delta + volume) >> 1;
			this->phase = phase;
		}
	}
	
	delay = time - end_time;
}